

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
accept<asio::basic_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          *peer,endpoint_type *peer_endpoint,error_code *ec)

{
  state_type state;
  bool bVar1;
  socket_type sVar2;
  error_code eVar3;
  size_t *local_98;
  socket_addr_type *local_88;
  size_t local_78;
  socket_type local_60 [5];
  socket_holder local_4c;
  size_t sStack_48;
  socket_holder new_socket;
  size_t addr_len;
  error_code *ec_local;
  endpoint_type *peer_endpoint_local;
  basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *peer_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  error_category *local_10;
  
  bVar1 = basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::is_open(peer);
  if (bVar1) {
    std::error_code::operator=(ec,already_open);
    this_local = *(reactive_socket_service<asio::ip::tcp> **)ec;
    local_10 = ec->_M_cat;
  }
  else {
    if (peer_endpoint == (endpoint_type *)0x0) {
      local_78 = 0;
    }
    else {
      local_78 = ip::basic_endpoint<asio::ip::tcp>::capacity(peer_endpoint);
    }
    sStack_48 = local_78;
    sVar2 = (impl->super_base_implementation_type).socket_;
    state = (impl->super_base_implementation_type).state_;
    if (peer_endpoint == (endpoint_type *)0x0) {
      local_88 = (socket_addr_type *)0x0;
      local_98 = (size_t *)0x0;
    }
    else {
      local_88 = ip::basic_endpoint<asio::ip::tcp>::data(peer_endpoint);
      local_98 = &stack0xffffffffffffffb8;
    }
    sVar2 = socket_ops::sync_accept(sVar2,state,local_88,local_98,ec);
    socket_holder::socket_holder(&local_4c,sVar2);
    sVar2 = socket_holder::get(&local_4c);
    if (sVar2 != -1) {
      if (peer_endpoint != (endpoint_type *)0x0) {
        ip::basic_endpoint<asio::ip::tcp>::resize(peer_endpoint,sStack_48);
      }
      local_60[0] = socket_holder::get(&local_4c);
      basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::assign(peer,&impl->protocol_,local_60,ec);
      bVar1 = std::error_code::operator_cast_to_bool(ec);
      if (!bVar1) {
        socket_holder::release(&local_4c);
      }
    }
    this_local = *(reactive_socket_service<asio::ip::tcp> **)ec;
    local_10 = ec->_M_cat;
    socket_holder::~socket_holder(&local_4c);
  }
  eVar3._0_8_ = (ulong)this_local & 0xffffffff;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

asio::error_code accept(implementation_type& impl,
      Socket& peer, endpoint_type* peer_endpoint, asio::error_code& ec)
  {
    // We cannot accept a socket that is already open.
    if (peer.is_open())
    {
      ec = asio::error::already_open;
      return ec;
    }

    std::size_t addr_len = peer_endpoint ? peer_endpoint->capacity() : 0;
    socket_holder new_socket(socket_ops::sync_accept(impl.socket_,
          impl.state_, peer_endpoint ? peer_endpoint->data() : 0,
          peer_endpoint ? &addr_len : 0, ec));

    // On success, assign new connection to peer socket object.
    if (new_socket.get() != invalid_socket)
    {
      if (peer_endpoint)
        peer_endpoint->resize(addr_len);
      peer.assign(impl.protocol_, new_socket.get(), ec);
      if (!ec)
        new_socket.release();
    }

    return ec;
  }